

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGenerator.cxx
# Opt level: O0

string * __thiscall
cmInstallGenerator::ConvertToAbsoluteDestination
          (string *__return_storage_ptr__,cmInstallGenerator *this,string *dest)

{
  bool bVar1;
  ulong uVar2;
  char *in_name;
  string *dest_local;
  cmInstallGenerator *this_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    in_name = (char *)std::__cxx11::string::c_str();
    bVar1 = cmsys::SystemTools::FileIsFullPath(in_name);
    if (!bVar1) {
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,"${CMAKE_INSTALL_PREFIX}/");
    }
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)dest);
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallGenerator::ConvertToAbsoluteDestination(
  std::string const& dest) const
{
  std::string result;
  if (!dest.empty() && !cmSystemTools::FileIsFullPath(dest.c_str())) {
    result = "${CMAKE_INSTALL_PREFIX}/";
  }
  result += dest;
  return result;
}